

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O1

void __thiscall
CVmObjStringBuffer::adjust_args(CVmObjStringBuffer *this,int32_t *idx,int32_t *len,int32_t *ins)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  if (*idx < 0) {
    iVar2 = 0;
LAB_002bab25:
    *idx = iVar2;
  }
  else {
    iVar2 = *piVar1;
    if (iVar2 < *idx) goto LAB_002bab25;
  }
  if (len != (int32_t *)0x0) {
    if (*len < 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = *piVar1;
      if (*len + *idx <= iVar2) goto LAB_002bab44;
      iVar2 = iVar2 - *idx;
    }
    *len = iVar2;
  }
LAB_002bab44:
  if ((ins != (int32_t *)0x0) && (*ins < 0)) {
    *ins = 0;
    return;
  }
  return;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }